

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupAndConesLimit_rec(Gia_Man_t *pNew,Gia_Man_t *p,int iObj,int Level)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int Level_local;
  int iObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  if (pObj_00->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if ((iVar1 == 0) || (iVar1 = Gia_ObjLevel(p,pObj_00), iVar1 < Level)) {
      uVar2 = Gia_ManAppendCi(pNew);
      pObj_00->Value = uVar2;
    }
    else {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      Gia_ManDupAndConesLimit_rec(pNew,p,iVar1,Level);
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      Gia_ManDupAndConesLimit_rec(pNew,p,iVar1,Level);
      iVar1 = Gia_ObjFanin0Copy(pObj_00);
      iLit1 = Gia_ObjFanin1Copy(pObj_00);
      uVar2 = Gia_ManAppendAnd(pNew,iVar1,iLit1);
      pObj_00->Value = uVar2;
    }
  }
  return;
}

Assistant:

void Gia_ManDupAndConesLimit_rec( Gia_Man_t * pNew, Gia_Man_t * p, int iObj, int Level )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( ~pObj->Value )
        return;
    if ( !Gia_ObjIsAnd(pObj) || Gia_ObjLevel(p, pObj) < Level )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        //printf( "PI %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
        return;
    }
    Gia_ManDupAndConesLimit_rec( pNew, p, Gia_ObjFaninId0(pObj, iObj), Level );
    Gia_ManDupAndConesLimit_rec( pNew, p, Gia_ObjFaninId1(pObj, iObj), Level );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    //printf( "Obj %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
}